

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_sinsn(easm_sinsn *sinsn)

{
  int local_14;
  int i;
  easm_sinsn *sinsn_local;
  
  if (sinsn != (easm_sinsn *)0x0) {
    for (local_14 = 0; local_14 < sinsn->operandsnum; local_14 = local_14 + 1) {
      easm_del_operand(sinsn->operands[local_14]);
    }
    free(sinsn->operands);
    free(sinsn->str);
    easm_del_mods(sinsn->mods);
    free(sinsn);
  }
  return;
}

Assistant:

void easm_del_sinsn(struct easm_sinsn *sinsn) {
	if (!sinsn) return;
	int i;
	for (i = 0; i < sinsn->operandsnum; i++)
		easm_del_operand(sinsn->operands[i]);
	free(sinsn->operands);
	free(sinsn->str);
	easm_del_mods(sinsn->mods);
	free(sinsn);
}